

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

void longvectorN(fft_data *sig,int N,int *array,int tx)

{
  int iVar1;
  double dVar2;
  double theta;
  int local_38;
  int k;
  int j;
  int ct;
  int Ls;
  int i;
  int L;
  int tx_local;
  int *array_local;
  int N_local;
  fft_data *sig_local;
  
  Ls = 1;
  k = 0;
  for (ct = 0; ct < tx; ct = ct + 1) {
    Ls = Ls * array[(tx + -1) - ct];
    iVar1 = array[(tx + -1) - ct];
    for (local_38 = 0; local_38 < Ls / iVar1; local_38 = local_38 + 1) {
      for (theta._4_4_ = 0; theta._4_4_ < array[(tx + -1) - ct] + -1; theta._4_4_ = theta._4_4_ + 1)
      {
        dVar2 = cos((double)((theta._4_4_ + 1) * local_38) * (-6.283185307179586 / (double)Ls));
        sig[k].re = dVar2;
        dVar2 = sin((double)((theta._4_4_ + 1) * local_38) * (-6.283185307179586 / (double)Ls));
        sig[k].im = dVar2;
        k = k + 1;
      }
    }
  }
  return;
}

Assistant:

void longvectorN(fft_data *sig,int N, int *array, int tx) {
	int L,i,Ls,ct,j,k;
	fft_type theta;
	L = 1;
	ct = 0;
	for (i = 0; i < tx; i++) {
		L = L * array[tx-1-i];
		Ls = L / array[tx-1-i];
		theta = -1.0 * PI2/L;
		for (j = 0; j < Ls;j++) {
			for (k = 0; k < array[tx-1-i] -1 ;k++) {
				sig[ct].re = cos((k+1)*j*theta);
				sig[ct].im = sin((k+1)*j*theta);
				ct++;
			}
		}

	}

}